

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
tinyusdz::lerp<tinyusdz::value::color4d>
          (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *a,
          vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *b,double t)

{
  double *pdVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  ulong __new_size;
  bool bVar5;
  color4d local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = (long)(a->
                super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar3 <= __new_size) {
    __new_size = uVar3;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar4 = 0;
      while (bVar5 = __new_size != 0, __new_size = __new_size - 1, bVar5) {
        lerp<tinyusdz::value::color4d>
                  (&local_50,
                   (color4d *)
                   ((long)&((a->
                            super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                            )._M_impl.super__Vector_impl_data._M_start)->r + lVar4),
                   (color4d *)
                   ((long)&((b->
                            super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                            )._M_impl.super__Vector_impl_data._M_start)->r + lVar4),t);
        pcVar2 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)((long)&pcVar2->b + lVar4);
        *pdVar1 = local_50.b;
        pdVar1[1] = local_50.a;
        pdVar1 = (double *)((long)&pcVar2->r + lVar4);
        *pdVar1 = local_50.r;
        pdVar1[1] = local_50.g;
        lVar4 = lVar4 + 0x20;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}